

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O2

void multifast_rep_flush(AC_TRIE_t *thiz,int keep)

{
  MF_REPLACEMENT_DATA_t *rd;
  long lStack_20;
  
  rd = &thiz->repdata;
  if (keep == 0) {
    mf_repdata_do_replace(rd,thiz->base_position);
    (*(thiz->repdata).cbf)(&rd->buffer,(thiz->repdata).user);
    (thiz->repdata).buffer.length = 0;
    (thiz->repdata).backlog.length = 0;
    (thiz->repdata).noms_size = 0;
    (thiz->repdata).curser = 0;
    thiz->last_node = thiz->root;
    lStack_20 = 0x28;
  }
  else {
    (*(thiz->repdata).cbf)(&rd->buffer,(thiz->repdata).user);
    lStack_20 = 0x48;
  }
  *(undefined8 *)((long)&thiz->root + lStack_20) = 0;
  return;
}

Assistant:

void multifast_rep_flush (AC_TRIE_t *thiz, int keep)
{
    if (!keep)
    {
        mf_repdata_do_replace (&thiz->repdata, thiz->base_position);
    }
    
    mf_repdata_flush (&thiz->repdata);
    
    if (!keep)
    {
        mf_repdata_reset (&thiz->repdata);
        thiz->last_node = thiz->root;
        thiz->base_position = 0;
    }
}